

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

shared_ptr<CellType> __thiscall GameEngine::getCell(GameEngine *this,size_t posX,size_t posY)

{
  element_type *peVar1;
  size_t sVar2;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *this_00;
  reference pvVar3;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<CellType> sVar5;
  size_t posY_local;
  size_t posX_local;
  GameEngine *this_local;
  
  peVar1 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)posX);
  sVar2 = Map::getWidth(peVar1);
  if (posY < sVar2) {
    peVar1 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)posX);
    sVar2 = Map::getHeight(peVar1);
    if (in_RCX < sVar2) {
      peVar1 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)posX
                         );
      this_00 = Map::operator[](peVar1,in_RCX);
      pvVar3 = std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
               operator[](this_00,posY);
      std::shared_ptr<CellType>::shared_ptr((shared_ptr<CellType> *)this,pvVar3);
      _Var4._M_pi = extraout_RDX;
      goto LAB_001a08e3;
    }
  }
  std::shared_ptr<CellType>::shared_ptr((shared_ptr<CellType> *)this,(nullptr_t)0x0);
  _Var4._M_pi = extraout_RDX_00;
LAB_001a08e3:
  sVar5.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<CellType>)sVar5.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CellType> GameEngine::getCell(size_t posX, size_t posY) {
  if ((posX >= 0) && (posY >= 0) && (posX < map->getWidth()) && (posY < map->getHeight())) {
    return (*map)[posY][posX];
  } else {
    return nullptr;
  }
}